

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_perform_authentication(Curl_easy *data)

{
  curl_trc_feat *pcVar1;
  _Bool _Var2;
  CURLcode CVar3;
  SASL *sasl;
  saslprogress progress;
  
  if ((*(byte *)((long)&data->conn->proto + 0xd0) & 0x10) != 0) {
    sasl = &(data->conn->proto).imapc.sasl;
    _Var2 = Curl_sasl_can_authenticate(sasl,data);
    if (_Var2) {
      CVar3 = Curl_sasl_start(sasl,data,false,&progress);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      if (progress == SASL_INPROGRESS) {
        smtp_state(data,SMTP_AUTH);
        return CURLE_OK;
      }
      if (((data->set).field_0x8cd & 0x10) == 0) {
        return CURLE_LOGIN_DENIED;
      }
      pcVar1 = (data->state).feat;
      if ((pcVar1 != (curl_trc_feat *)0x0) && (pcVar1->log_level < 1)) {
        return CURLE_LOGIN_DENIED;
      }
      Curl_infof(data,"No known authentication mechanisms supported");
      return CURLE_LOGIN_DENIED;
    }
  }
  smtp_state(data,SMTP_STOP);
  return CURLE_OK;
}

Assistant:

static CURLcode smtp_perform_authentication(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  saslprogress progress;

  /* Check we have enough data to authenticate with, and the
     server supports authentication, and end the connect phase if not */
  if(!smtpc->auth_supported ||
     !Curl_sasl_can_authenticate(&smtpc->sasl, data)) {
    smtp_state(data, SMTP_STOP);
    return result;
  }

  /* Calculate the SASL login details */
  result = Curl_sasl_start(&smtpc->sasl, data, FALSE, &progress);

  if(!result) {
    if(progress == SASL_INPROGRESS)
      smtp_state(data, SMTP_AUTH);
    else {
      /* Other mechanisms not supported */
      infof(data, "No known authentication mechanisms supported");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}